

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Population.cpp
# Opt level: O3

Population * __thiscall
Population::selection(Population *__return_storage_ptr__,Population *this,int generation)

{
  pointer pCVar1;
  double dVar2;
  ulong uVar3;
  undefined8 uVar4;
  ulong uVar5;
  int iVar6;
  undefined1 auVar7 [16];
  vector<Chromosome,_std::allocator<Chromosome>_> new_chromosomes;
  default_random_engine generator;
  vector<Chromosome,_std::allocator<Chromosome>_> local_78;
  double local_58;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> local_50;
  vector<Chromosome,_std::allocator<Chromosome>_> local_48;
  
  local_50._M_x = 1;
  local_78.super__Vector_base<Chromosome,_std::allocator<Chromosome>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.super__Vector_base<Chromosome,_std::allocator<Chromosome>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.super__Vector_base<Chromosome,_std::allocator<Chromosome>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((this->chromosomes).super__Vector_base<Chromosome,_std::allocator<Chromosome>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->chromosomes).super__Vector_base<Chromosome,_std::allocator<Chromosome>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_58 = (double)((float)generation / 300.0 + 0.5);
    iVar6 = 0;
    do {
      dVar2 = std::
              generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                        (&local_50);
      dVar2 = log(1.0 - dVar2);
      if (-dVar2 / local_58 < 1.0) {
        pCVar1 = (this->chromosomes).super__Vector_base<Chromosome,_std::allocator<Chromosome>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        uVar5 = ((long)(this->chromosomes).
                       super__Vector_base<Chromosome,_std::allocator<Chromosome>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)pCVar1 >> 5) * -0x5555555555555555;
        auVar7._8_4_ = (int)(uVar5 >> 0x20);
        auVar7._0_8_ = uVar5;
        auVar7._12_4_ = 0x45300000;
        uVar3 = (ulong)(int)((-dVar2 / local_58) *
                            ((auVar7._8_8_ - 1.9342813113834067e+25) +
                            ((double)CONCAT44(0x43300000,(int)uVar5) - 4503599627370496.0)));
        if (uVar5 < uVar3 || uVar5 - uVar3 == 0) {
          uVar4 = std::__throw_out_of_range_fmt
                            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                             ,uVar3);
          std::vector<Chromosome,_std::allocator<Chromosome>_>::~vector(&local_48);
          std::vector<Chromosome,_std::allocator<Chromosome>_>::~vector(&local_78);
          _Unwind_Resume(uVar4);
        }
        std::vector<Chromosome,_std::allocator<Chromosome>_>::push_back(&local_78,pCVar1 + uVar3);
        iVar6 = iVar6 + 1;
      }
      uVar3 = ((long)(this->chromosomes).super__Vector_base<Chromosome,_std::allocator<Chromosome>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->chromosomes).super__Vector_base<Chromosome,_std::allocator<Chromosome>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5) * -0x5555555555555555;
    } while ((ulong)(long)iVar6 <= uVar3 && uVar3 - (long)iVar6 != 0);
  }
  std::vector<Chromosome,_std::allocator<Chromosome>_>::vector(&local_48,&local_78);
  Population(__return_storage_ptr__,&local_48);
  std::vector<Chromosome,_std::allocator<Chromosome>_>::~vector(&local_48);
  std::vector<Chromosome,_std::allocator<Chromosome>_>::~vector(&local_78);
  return __return_storage_ptr__;
}

Assistant:

Population Population::selection(int generation) {

    std::default_random_engine generator;

    float ex = (float) (0.5 + (generation / 300.0));
    std::exponential_distribution<double> distribution(ex);

    std::vector<Chromosome> new_chromosomes;

    for(int i = 0; i < chromosomes.size();){
        double number = distribution(generator);
        if (number<1.0){
            i++;
            int position = int(chromosomes.size()*number);
            new_chromosomes.push_back(chromosomes.at(position));
        }
    }

    return Population(new_chromosomes);
}